

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::cord_internal::CordzHandle::CordzHandle(CordzHandle *this,bool is_snapshot)

{
  undefined3 in_register_00000031;
  
  this->_vptr_CordzHandle = (_func_int **)&PTR__CordzHandle_00463f10;
  this->is_snapshot_ = is_snapshot;
  this->dq_prev_ = (CordzHandle *)0x0;
  this->dq_next_ = (CordzHandle *)0x0;
  anon_unknown_0::GlobalQueue();
  if (CONCAT31(in_register_00000031,is_snapshot) != 0) {
    Mutex::Lock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
    if (anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ != 0) {
      this->dq_prev_ = (CordzHandle *)anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_;
      *(CordzHandle **)(anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ + 0x18) = this;
    }
    anon_unknown_0::GlobalQueue::global_queue.impl_.space_._8_8_ = this;
    Mutex::Unlock((Mutex *)&anon_unknown_0::GlobalQueue::global_queue);
  }
  return;
}

Assistant:

CordzHandle::CordzHandle(bool is_snapshot) : is_snapshot_(is_snapshot) {
  Queue& global_queue = GlobalQueue();
  if (is_snapshot) {
    MutexLock lock(&global_queue.mutex);
    CordzHandle* dq_tail = global_queue.dq_tail.load(std::memory_order_acquire);
    if (dq_tail != nullptr) {
      dq_prev_ = dq_tail;
      dq_tail->dq_next_ = this;
    }
    global_queue.dq_tail.store(this, std::memory_order_release);
  }
}